

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DExporter::IndentationStringSet(X3DExporter *this,size_t pNewLevel)

{
  string *psVar1;
  ulong uVar2;
  long lVar3;
  
  psVar1 = &this->mIndentationString;
  uVar2 = (this->mIndentationString)._M_string_length;
  if (uVar2 < pNewLevel) {
    uVar2 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(this->mIndentationString)._M_dataplus._M_p != &(this->mIndentationString).field_2) {
      uVar2 = (this->mIndentationString).field_2._M_allocated_capacity;
    }
    if (uVar2 < pNewLevel) {
      std::__cxx11::string::reserve((ulong)psVar1);
    }
    for (lVar3 = pNewLevel - (this->mIndentationString)._M_string_length; lVar3 != 0;
        lVar3 = lVar3 + -1) {
      std::__cxx11::string::push_back((char)psVar1);
    }
  }
  else if (pNewLevel < uVar2) {
    std::__cxx11::string::resize((ulong)psVar1,(char)pNewLevel);
    return;
  }
  return;
}

Assistant:

void X3DExporter::IndentationStringSet(const size_t pNewLevel)
{
	if(pNewLevel > mIndentationString.size())
	{
		if(pNewLevel > mIndentationString.capacity()) mIndentationString.reserve(pNewLevel + 1);

		for(size_t i = 0, i_e = pNewLevel - mIndentationString.size(); i < i_e; i++) mIndentationString.push_back('\t');
	}
	else if(pNewLevel < mIndentationString.size())
	{
		mIndentationString.resize(pNewLevel);
	}
}